

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseComplexTerminal(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *pSVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lexeme *pLVar3;
  undefined4 extraout_var_01;
  SynIdentifier *this;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  InplaceStr name;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_oparen) {
    ctx->currentLexeme = begin + 1;
    if (0xff < ctx->expressionGroupDepth) {
      anon_unknown.dwarf_147a9::Stop(ctx,begin + 1,"ERROR: reached nested \'(\' limit of %d",0x100);
    }
    ctx->expressionGroupDepth = ctx->expressionGroupDepth + 1;
    this = (SynIdentifier *)ParseAssignment(ctx);
    ctx->expressionGroupDepth = ctx->expressionGroupDepth - 1;
    if (this == (SynIdentifier *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'(\'");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (SynIdentifier *)CONCAT44(extraout_var_01,iVar1);
      SynError::SynError((SynError *)this,ctx->currentLexeme,ctx->currentLexeme);
    }
    anon_unknown.dwarf_147a9::CheckConsume
              (ctx,lex_cparen,"ERROR: closing \')\' not found after \'(\'");
  }
  else {
    if (begin->type == lex_mul) {
      ctx->currentLexeme = begin + 1;
      pSVar2 = ParseTerminal(ctx);
      if (pSVar2 == (SynBase *)0x0) {
        anon_unknown.dwarf_147a9::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'*\'");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar2 = (SynBase *)CONCAT44(extraout_var,iVar1);
        SynError::SynError((SynError *)pSVar2,ctx->currentLexeme,ctx->currentLexeme);
      }
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pLVar3 = ParseContext::Previous(ctx);
      SynDereference::SynDereference
                ((SynDereference *)CONCAT44(extraout_var_00,iVar1),begin,pLVar3,pSVar2);
      return &((SynDereference *)CONCAT44(extraout_var_00,iVar1))->super_SynBase;
    }
    this = (SynIdentifier *)ParseString(ctx);
    if (((this == (SynIdentifier *)0x0) &&
        (this = (SynIdentifier *)ParseArray(ctx), this == (SynIdentifier *)0x0)) &&
       (this = (SynIdentifier *)ParseType(ctx,(bool *)0x0,false), this == (SynIdentifier *)0x0)) {
      pLVar3 = ctx->currentLexeme;
      if (pLVar3->type == lex_at) {
        ctx->currentLexeme = pLVar3 + 1;
        if (0x22 < pLVar3[1].type - lex_add) {
          anon_unknown.dwarf_147a9::Report(ctx,pLVar3 + 1,"ERROR: name expected after \'@\'");
          iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          SynError::SynError((SynError *)CONCAT44(extraout_var_03,iVar1),ctx->currentLexeme,
                             ctx->currentLexeme);
          return (SynBase *)CONCAT44(extraout_var_03,iVar1);
        }
      }
      else if (pLVar3->type != lex_string) {
        return (SynBase *)0x0;
      }
      name = ParseContext::Consume(ctx);
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_02,iVar1);
      pLVar3 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(this,begin,pLVar3,name);
    }
  }
  pSVar2 = ParsePostExpressions(ctx,&this->super_SynBase);
  return pSVar2;
}

Assistant:

SynBase* ParseComplexTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_mul))
	{
		SynBase *node = ParseTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '*'");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynDereference>()) SynDereference(start, ctx.Previous(), node);
	}

	SynBase *node = NULL;

	if(ctx.Consume(lex_oparen))
	{
		const unsigned groupLimit = 256;

		if(ctx.expressionGroupDepth >= groupLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested '(' limit of %d", groupLimit);

		ctx.expressionGroupDepth++;

		node = ParseAssignment(ctx);

		ctx.expressionGroupDepth--;

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '('");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after '('");
	}

	if(!node)
		node = ParseString(ctx);

	if(!node)
		node = ParseArray(ctx);

	if(!node)
		node = ParseType(ctx);

	if(!node && ctx.At(lex_string))
	{
		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node && ctx.Consume(lex_at))
	{
		bool isOperator = (ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot;

		if(!isOperator)
		{
			Report(ctx, ctx.Current(), "ERROR: name expected after '@'");

			return new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node)
		return NULL;
		
	return ParsePostExpressions(ctx, node);
}